

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_dynamic_state<VkRayTracingPipelineCreateInfoKHR>
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info,ScratchAllocator *alloc,
          DynamicStateInfo *param_3)

{
  VkPipelineDynamicStateCreateInfo *pVVar1;
  VkDynamicState *__src;
  void *pvVar2;
  uint32_t uVar3;
  VkStructureType VVar4;
  undefined4 uVar5;
  VkPipelineDynamicStateCreateInfo *pVVar6;
  VkDynamicState *pVVar7;
  size_t size;
  string local_48;
  
  pVVar1 = info->pDynamicState;
  if (pVVar1 != (VkPipelineDynamicStateCreateInfo *)0x0) {
    if (pVVar1->pNext != (void *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"pNext in VkPipelineDynamicStateCreateInfo not supported.","");
      log_error_pnext_chain(&local_48,info->pDynamicState->pNext);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    pVVar6 = (VkPipelineDynamicStateCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
    if (pVVar6 != (VkPipelineDynamicStateCreateInfo *)0x0) {
      VVar4 = pVVar1->sType;
      uVar5 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      uVar3 = pVVar1->dynamicStateCount;
      pVVar7 = pVVar1->pDynamicStates;
      pVVar6->flags = pVVar1->flags;
      pVVar6->dynamicStateCount = uVar3;
      pVVar6->pDynamicStates = pVVar7;
      pVVar6->sType = VVar4;
      *(undefined4 *)&pVVar6->field_0x4 = uVar5;
      pVVar6->pNext = pvVar2;
    }
    info->pDynamicState = pVVar6;
  }
  pVVar1 = info->pDynamicState;
  if (pVVar1 != (VkPipelineDynamicStateCreateInfo *)0x0) {
    if ((ulong)pVVar1->dynamicStateCount == 0) {
      pVVar7 = (VkDynamicState *)0x0;
    }
    else {
      __src = pVVar1->pDynamicStates;
      size = (ulong)pVVar1->dynamicStateCount << 2;
      pVVar7 = (VkDynamicState *)ScratchAllocator::allocate_raw(alloc,size,0x10);
      if (pVVar7 != (VkDynamicState *)0x0) {
        memmove(pVVar7,__src,size);
      }
    }
    info->pDynamicState->pDynamicStates = pVVar7;
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_dynamic_state(CreateInfo *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *)
{
	if (info->pDynamicState)
	{
		if (info->pDynamicState->pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineDynamicStateCreateInfo not supported.",
								  info->pDynamicState->pNext);
			return false;
		}
		info->pDynamicState = copy(info->pDynamicState, 1, alloc);
	}

	if (info->pDynamicState)
	{
		const_cast<VkPipelineDynamicStateCreateInfo *>(info->pDynamicState)->pDynamicStates =
				copy(info->pDynamicState->pDynamicStates, info->pDynamicState->dynamicStateCount, alloc);
	}

	return true;
}